

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.cpp
# Opt level: O3

void __thiscall piksel::BaseApp::fullscreenchangeCallback(BaseApp *this,bool isFullscreen)

{
  return;
}

Assistant:

void BaseApp::fullscreenchangeCallback(bool isFullscreen) {
#ifdef __EMSCRIPTEN__
    if (!isFullscreen) {
        EM_ASM(
            setTimeout(function() {
                var canvas = document.getElementById('canvas');
                canvas.style.width = (canvas.width / window.devicePixelRatio) + 'px';
                canvas.style.height = (canvas.height / window.devicePixelRatio) + 'px';
            }, 0); // dirty hack :)
        );
    }
#endif
}